

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O3

void __thiscall hrvo::Simulator::~Simulator(Simulator *this)

{
  Agent *pAVar1;
  KdTree *this_00;
  pointer ppGVar2;
  pointer ppAVar3;
  
  pAVar1 = this->defaults_;
  if (pAVar1 != (Agent *)0x0) {
    Agent::~Agent(pAVar1);
  }
  operator_delete(pAVar1);
  this->defaults_ = (Agent *)0x0;
  this_00 = this->kdTree_;
  if (this_00 != (KdTree *)0x0) {
    KdTree::~KdTree(this_00);
  }
  operator_delete(this_00);
  this->kdTree_ = (KdTree *)0x0;
  for (ppAVar3 = (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppAVar3 !=
      (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppAVar3 = ppAVar3 + 1) {
    pAVar1 = *ppAVar3;
    if (pAVar1 != (Agent *)0x0) {
      Agent::~Agent(pAVar1);
    }
    operator_delete(pAVar1);
    *ppAVar3 = (Agent *)0x0;
  }
  ppGVar2 = (this->goals_).super__Vector_base<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppGVar2 !=
      (this->goals_).super__Vector_base<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      operator_delete(*ppGVar2);
      *ppGVar2 = (Goal *)0x0;
      ppGVar2 = ppGVar2 + 1;
    } while (ppGVar2 !=
             (this->goals_).super__Vector_base<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    ppGVar2 = (this->goals_).super__Vector_base<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>._M_impl
              .super__Vector_impl_data._M_start;
  }
  if (ppGVar2 != (pointer)0x0) {
    operator_delete(ppGVar2);
  }
  ppAVar3 = (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar3 != (pointer)0x0) {
    operator_delete(ppAVar3);
    return;
  }
  return;
}

Assistant:

Simulator::~Simulator() {
  delete defaults_;
  defaults_ = NULL;

  delete kdTree_;
  kdTree_ = NULL;

  for (std::vector<Agent *>::iterator iter = agents_.begin();
       iter != agents_.end(); ++iter) {
    delete *iter;
    *iter = NULL;
  }

  for (std::vector<Goal *>::iterator iter = goals_.begin();
       iter != goals_.end(); ++iter) {
    delete *iter;
    *iter = NULL;
  }
}